

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_selector<2,0,true>::
     run<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>const>,4>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,false>>
               (GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>
                *prod,Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false> *dest,
               Scalar *alpha)

{
  PointerArgType pdVar1;
  Index IVar2;
  Index lhsStride;
  double *pdVar3;
  Index rows;
  Index cols;
  Scalar *lhs;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_> *other;
  size_t size;
  Index IVar4;
  _LhsNested *p_Var5;
  _RhsNested *p_Var6;
  ulong uVar7;
  Index IVar8;
  Index rhsIncr;
  ScalarWithConstIfNotLvalue *pSVar9;
  Scalar SVar10;
  Scalar SVar11;
  ScalarWithConstIfNotLvalue SStack_208;
  PointerArgType local_200;
  Index local_1f8;
  PointerArgType local_1f0;
  Index local_1e8;
  Index local_1e0;
  Index local_1d8;
  double *local_1d0;
  Index local_1c8;
  Index local_1c0;
  Scalar *local_1b8;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_> *local_1b0;
  PointerArgType local_1a8;
  Index local_1a0;
  PointerArgType local_198;
  Index local_190;
  double *local_188;
  size_t local_180;
  double *local_178;
  ScalarWithConstIfNotLvalue *local_170;
  ScalarWithConstIfNotLvalue *local_168;
  ScalarWithConstIfNotLvalue *local_160;
  ScalarWithConstIfNotLvalue *local_158;
  ScalarWithConstIfNotLvalue *local_150;
  Scalar local_148;
  double local_140;
  Stride<0,_0> local_132;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_130;
  Stride<0,_0> local_112;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_110;
  ScalarMultipleReturnType local_f8;
  Stride<0,_0> local_d2;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_d0;
  Stride<0,_0> local_b6 [7];
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_a8;
  undefined1 local_90 [8];
  aligned_stack_memory_handler<double> actualDestPtr_stack_memory_destructor;
  ResScalar *actualDestPtr;
  RhsScalar compatibleAlpha;
  bool evalToDest;
  bool alphaIsCompatible;
  double dStack_60;
  gemv_static_vector_if<double,__1,__1,_false> static_dest;
  ResScalar actualAlpha;
  ActualRhsType actualRhs;
  ActualLhsType actualLhs;
  Scalar *alpha_local;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false> *dest_local;
  GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>
  *prod_local;
  
  p_Var5 = ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
           ::lhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                );
  actualRhs.m_matrix.
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_outerStride
       = (Index)blas_traits<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>
                ::extract(p_Var5);
  p_Var6 = ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
           ::rhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                );
  blas_traits<Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
  ::extract((ExtractType *)&actualAlpha,p_Var6);
  local_148 = *alpha;
  p_Var5 = ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
           ::lhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                );
  SVar10 = blas_traits<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
           extractScalarFactor(p_Var5);
  local_140 = local_148 * SVar10;
  p_Var6 = ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
           ::rhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                );
  SVar11 = blas_traits<Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
           ::extractScalarFactor(p_Var6);
  dStack_60 = local_140 * SVar11;
  compatibleAlpha._6_1_ = 1;
  compatibleAlpha._5_1_ = 1;
  actualDestPtr = (ResScalar *)get_factor<double,_double>::run(&stack0xffffffffffffffa0);
  uVar7 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                      *)dest);
  if (0x1fffffffffffffff < uVar7) {
    throw_std_bad_alloc();
  }
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    local_150 = gemv_static_vector_if<double,_-1,_-1,_false>::data
                          ((gemv_static_vector_if<double,__1,__1,_false> *)
                           ((long)&compatibleAlpha + 7));
  }
  else {
    local_150 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_1>::
                data((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_1>
                      *)dest);
  }
  if (local_150 == (ScalarWithConstIfNotLvalue *)0x0) {
    IVar8 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::size
                      ((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                        *)dest);
    pSVar9 = &SStack_208;
    if ((ulong)(IVar8 * 8) < 0x20001) {
      IVar8 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::size
                        ((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                          *)dest);
      pSVar9 = (ScalarWithConstIfNotLvalue *)
               ((long)&SStack_208 - (IVar8 * 8 + 0xfU & 0xfffffffffffffff0));
      local_168 = pSVar9;
    }
    else {
      IVar8 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::size
                        ((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                          *)dest);
      local_168 = (ScalarWithConstIfNotLvalue *)aligned_malloc(IVar8 << 3);
    }
    local_160 = local_168;
  }
  else {
    if ((compatibleAlpha._5_1_ & 1) == 0) {
      local_158 = gemv_static_vector_if<double,_-1,_-1,_false>::data
                            ((gemv_static_vector_if<double,__1,__1,_false> *)
                             ((long)&compatibleAlpha + 7));
    }
    else {
      local_158 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_1>::
                  data((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_1>
                        *)dest);
    }
    pSVar9 = &SStack_208;
    local_160 = local_158;
  }
  actualDestPtr_stack_memory_destructor._16_8_ = local_160;
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    *(undefined8 *)((long)pSVar9 + -8) = 0x110499;
    local_170 = gemv_static_vector_if<double,_-1,_-1,_false>::data
                          ((gemv_static_vector_if<double,__1,__1,_false> *)
                           ((long)&compatibleAlpha + 7));
  }
  else {
    *(undefined8 *)((long)pSVar9 + -8) = 0x110487;
    local_170 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_1>::
                data((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_1>
                      *)dest);
  }
  if (local_170 == (ScalarWithConstIfNotLvalue *)0x0) {
    local_178 = (double *)actualDestPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_178 = (double *)0x0;
  }
  local_188 = local_178;
  *(undefined8 *)((long)pSVar9 + -8) = 0x1104dc;
  local_180 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::size
                        ((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                          *)dest);
  *(undefined8 *)((long)pSVar9 + -8) = 0x1104ec;
  IVar8 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                      *)dest);
  size = local_180;
  pdVar3 = local_188;
  *(undefined8 *)((long)pSVar9 + -8) = 0x110519;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_90,pdVar3,size,
             0x20000 < (ulong)(IVar8 * 8));
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    if ((compatibleAlpha._6_1_ & 1) == 0) {
      local_198 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      *(undefined8 *)((long)pSVar9 + -8) = 0x110541;
      local_190 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::
                  size((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                        *)dest);
      *(undefined8 *)((long)pSVar9 + -8) = 0x110556;
      Stride<0,_0>::Stride(local_b6);
      IVar2 = local_190;
      pdVar1 = local_198;
      *(undefined8 *)((long)pSVar9 + -8) = 0x110579;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_a8,pdVar1,IVar2,local_b6);
      *(undefined8 *)((long)pSVar9 + -8) = 0x110587;
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>::
      setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>
               *)&local_a8);
      actualDestPtr = (ResScalar *)0x3ff0000000000000;
    }
    else {
      local_1a8 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      local_1b0 = (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                   *)dest;
      *(undefined8 *)((long)pSVar9 + -8) = 0x1105d9;
      local_1a0 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::
                  size((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                        *)dest);
      *(undefined8 *)((long)pSVar9 + -8) = 0x1105ee;
      Stride<0,_0>::Stride(&local_d2);
      IVar2 = local_1a0;
      pdVar1 = local_1a8;
      *(undefined8 *)((long)pSVar9 + -8) = 0x110611;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_d0,pdVar1,IVar2,&local_d2);
      other = local_1b0;
      *(undefined8 *)((long)pSVar9 + -8) = 0x110626;
      Map<Eigen::Matrix<double,-1,1,0,-1,1>,1,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>> *)&local_d0,other);
    }
  }
  IVar4 = actualRhs.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          m_outerStride;
  *(undefined8 *)((long)pSVar9 + -8) = 0x110635;
  local_1c8 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::
              rows((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                    *)IVar4);
  IVar4 = actualRhs.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          m_outerStride;
  *(undefined8 *)((long)pSVar9 + -8) = 0x110645;
  local_1c0 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::
              cols((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                    *)IVar4);
  IVar4 = actualRhs.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          m_outerStride;
  *(undefined8 *)((long)pSVar9 + -8) = 0x110655;
  local_1b8 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>::
              data((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                    *)IVar4);
  IVar4 = actualRhs.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          m_outerStride;
  *(undefined8 *)((long)pSVar9 + -8) = 0x110667;
  local_1d8 = BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false,_true>::
              outerStride((BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                           *)IVar4);
  *(undefined8 *)((long)pSVar9 + -8) = 0x110677;
  local_1d0 = TransposeImpl<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_Eigen::Dense>
              ::data((TransposeImpl<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Dense>
                      *)&actualAlpha);
  *(undefined8 *)((long)pSVar9 + -8) = 0x110689;
  rhsIncr = TransposeImpl<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_Eigen::Dense>
            ::innerStride((TransposeImpl<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Dense>
                           *)&actualAlpha);
  lhs = local_1b8;
  cols = local_1c0;
  rows = local_1c8;
  pdVar3 = local_1d0;
  lhsStride = local_1d8;
  local_1e0 = rhsIncr;
  *(undefined8 *)((long)pSVar9 + -0x10) = actualDestPtr_stack_memory_destructor._16_8_;
  *(undefined8 *)((long)pSVar9 + -8) = 1;
  *(undefined8 *)((long)pSVar9 + -0x18) = 0x1106dc;
  general_matrix_vector_product<long,_double,_0,_false,_double,_false,_0>::run
            (rows,cols,lhs,lhsStride,pdVar3,rhsIncr,*(ResScalar **)((long)pSVar9 + -0x10),
             *(long *)((long)pSVar9 + -8),(double)actualDestPtr);
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    if ((compatibleAlpha._6_1_ & 1) == 0) {
      local_1f0 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      *(undefined8 *)((long)pSVar9 + -8) = 0x110706;
      local_1e8 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::
                  size((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                        *)dest);
      *(undefined8 *)((long)pSVar9 + -8) = 0x11071b;
      Stride<0,_0>::Stride(&local_112);
      IVar2 = local_1e8;
      pdVar1 = local_1f0;
      *(undefined8 *)((long)pSVar9 + -8) = 0x11073e;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_110,pdVar1,IVar2,&local_112);
      *(undefined8 *)((long)pSVar9 + -8) = 0x110757;
      Eigen::operator*(&local_f8,&stack0xffffffffffffffa0,(StorageBaseType *)&local_110);
      *(undefined8 *)((long)pSVar9 + -8) = 0x110769;
      MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,false>>::operator+=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,false>> *)dest,
                 (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_f8);
    }
    else {
      local_200 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      *(undefined8 *)((long)pSVar9 + -8) = 0x110781;
      local_1f8 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::
                  size((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                        *)dest);
      *(undefined8 *)((long)pSVar9 + -8) = 0x110796;
      Stride<0,_0>::Stride(&local_132);
      IVar2 = local_1f8;
      pdVar1 = local_200;
      *(undefined8 *)((long)pSVar9 + -8) = 0x1107b9;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_130,pdVar1,IVar2,&local_132);
      *(undefined8 *)((long)pSVar9 + -8) = 0x1107cb;
      Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,false> *)dest,
                 (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>
                  *)&local_130);
    }
  }
  *(undefined8 *)((long)pSVar9 + -8) = 0x1107dd;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_90);
  return;
}

Assistant:

static inline void run(const ProductType& prod, Dest& dest, const typename ProductType::Scalar& alpha)
  {
    typedef typename ProductType::Index Index;
    typedef typename ProductType::LhsScalar   LhsScalar;
    typedef typename ProductType::RhsScalar   RhsScalar;
    typedef typename ProductType::Scalar      ResScalar;
    typedef typename ProductType::RealScalar  RealScalar;
    typedef typename ProductType::ActualLhsType ActualLhsType;
    typedef typename ProductType::ActualRhsType ActualRhsType;
    typedef typename ProductType::LhsBlasTraits LhsBlasTraits;
    typedef typename ProductType::RhsBlasTraits RhsBlasTraits;
    typedef Map<Matrix<ResScalar,Dynamic,1>, Aligned> MappedDest;

    ActualLhsType actualLhs = LhsBlasTraits::extract(prod.lhs());
    ActualRhsType actualRhs = RhsBlasTraits::extract(prod.rhs());

    ResScalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(prod.lhs())
                                  * RhsBlasTraits::extractScalarFactor(prod.rhs());

    // make sure Dest is a compile-time vector type (bug 1166)
    typedef typename conditional<Dest::IsVectorAtCompileTime, Dest, typename Dest::ColXpr>::type ActualDest;

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      EvalToDestAtCompileTime = (ActualDest::InnerStrideAtCompileTime==1),
      ComplexByReal = (NumTraits<LhsScalar>::IsComplex) && (!NumTraits<RhsScalar>::IsComplex),
      MightCannotUseDest = (ActualDest::InnerStrideAtCompileTime!=1) || ComplexByReal
    };

    gemv_static_vector_if<ResScalar,ActualDest::SizeAtCompileTime,ActualDest::MaxSizeAtCompileTime,MightCannotUseDest> static_dest;

    bool alphaIsCompatible = (!ComplexByReal) || (numext::imag(actualAlpha)==RealScalar(0));
    bool evalToDest = EvalToDestAtCompileTime && alphaIsCompatible;
    
    RhsScalar compatibleAlpha = get_factor<ResScalar,RhsScalar>::run(actualAlpha);

    ei_declare_aligned_stack_constructed_variable(ResScalar,actualDestPtr,dest.size(),
                                                  evalToDest ? dest.data() : static_dest.data());
    
    if(!evalToDest)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      int size = dest.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      if(!alphaIsCompatible)
      {
        MappedDest(actualDestPtr, dest.size()).setZero();
        compatibleAlpha = RhsScalar(1);
      }
      else
        MappedDest(actualDestPtr, dest.size()) = dest;
    }

    general_matrix_vector_product
      <Index,LhsScalar,ColMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        actualLhs.data(), actualLhs.outerStride(),
        actualRhs.data(), actualRhs.innerStride(),
        actualDestPtr, 1,
        compatibleAlpha);

    if (!evalToDest)
    {
      if(!alphaIsCompatible)
        dest += actualAlpha * MappedDest(actualDestPtr, dest.size());
      else
        dest = MappedDest(actualDestPtr, dest.size());
    }
  }